

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::exit(App *this,int __status)

{
  bool bVar1;
  int iVar2;
  ostream *this_00;
  ostream *in_RCX;
  ostream *in_RDX;
  undefined4 in_register_00000034;
  long local_138;
  long local_118;
  long local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  string local_50;
  ostream *local_30;
  ostream *err_local;
  ostream *out_local;
  Error *e_local;
  App *this_local;
  
  out_local = (ostream *)CONCAT44(in_register_00000034,__status);
  local_30 = in_RCX;
  err_local = in_RDX;
  e_local = (Error *)this;
  if (out_local == (ostream *)0x0) {
    local_108 = 0;
  }
  else {
    local_108 = __dynamic_cast(out_local,&Error::typeinfo,&RuntimeError::typeinfo);
  }
  if (local_108 == 0) {
    if (out_local == (ostream *)0x0) {
      local_118 = 0;
    }
    else {
      local_118 = __dynamic_cast(out_local,&Error::typeinfo,&CallForHelp::typeinfo);
    }
    if (local_118 == 0) {
      if (out_local == (ostream *)0x0) {
        local_138 = 0;
      }
      else {
        local_138 = __dynamic_cast(out_local,&Error::typeinfo,&CallForAllHelp::typeinfo,0);
      }
      if (local_138 == 0) {
        iVar2 = Error::get_exit_code((Error *)out_local);
        if ((iVar2 != 0) &&
           (bVar1 = ::std::function::operator_cast_to_bool((function *)&this->failure_message_),
           bVar1)) {
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
          ::operator()(&local_f0,&this->failure_message_,this,(Error *)out_local);
          this_00 = ::std::operator<<(local_30,(string *)&local_f0);
          ::std::ostream::operator<<(this_00,::std::flush<char,std::char_traits<char>>);
          ::std::__cxx11::string::~string((string *)&local_f0);
        }
        Error::get_exit_code((Error *)out_local);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
        help(&local_a8,this,&local_c8,All);
        ::std::operator<<((ostream *)err_local,(string *)&local_a8);
        ::std::__cxx11::string::~string((string *)&local_a8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        Error::get_exit_code((Error *)out_local);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
      help(&local_50,this,&local_70,Normal);
      ::std::operator<<((ostream *)err_local,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
      Error::get_exit_code((Error *)out_local);
    }
  }
  else {
    Error::get_exit_code((Error *)out_local);
  }
  return;
}

Assistant:

int exit(const Error &e, std::ostream &out = std::cout, std::ostream &err = std::cerr) const {

        /// Avoid printing anything if this is a CLI::RuntimeError
        if(dynamic_cast<const CLI::RuntimeError *>(&e) != nullptr)
            return e.get_exit_code();

        if(dynamic_cast<const CLI::CallForHelp *>(&e) != nullptr) {
            out << help();
            return e.get_exit_code();
        }

        if(dynamic_cast<const CLI::CallForAllHelp *>(&e) != nullptr) {
            out << help("", AppFormatMode::All);
            return e.get_exit_code();
        }

        if(e.get_exit_code() != static_cast<int>(ExitCodes::Success)) {
            if(failure_message_)
                err << failure_message_(this, e) << std::flush;
        }

        return e.get_exit_code();
    }